

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizes
          (FieldDescriptorProto *this,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  char cVar2;
  uint uVar3;
  FieldOptions *value;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(1,this->name_,output);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 0x20) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,SERIALIZE)
    ;
    internal::WireFormatLite::WriteString(2,this->extendee_,output);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::WireFormatLite::WriteInt32(3,this->number_,output);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 4) != 0) {
    internal::WireFormatLite::WriteEnum(4,this->label_,output);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 8) != 0) {
    internal::WireFormatLite::WriteEnum(5,this->type_,output);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->type_name_->_M_dataplus)._M_p,(int)this->type_name_->_M_string_length,
               SERIALIZE);
    internal::WireFormatLite::WriteString(6,this->type_name_,output);
    uVar3 = this->_has_bits_[0];
  }
  cVar2 = (char)uVar3;
  if ((uVar3 & 0x40) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->default_value_->_M_dataplus)._M_p,(int)this->default_value_->_M_string_length,
               SERIALIZE);
    internal::WireFormatLite::WriteString(7,this->default_value_,output);
    cVar2 = (char)this->_has_bits_[0];
  }
  if (cVar2 < '\0') {
    value = this->options_;
    if (value == (FieldOptions *)0x0) {
      value = *(FieldOptions **)(default_instance_ + 0x38);
    }
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value,output);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void FieldDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // optional string extendee = 2;
  if (has_extendee()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->extendee(), output);
  }

  // optional int32 number = 3;
  if (has_number()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->number(), output);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (has_label()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->label(), output);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (has_type()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->type(), output);
  }

  // optional string type_name = 6;
  if (has_type_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      6, this->type_name(), output);
  }

  // optional string default_value = 7;
  if (has_default_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      7, this->default_value(), output);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->options(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}